

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::RoundUp(Vector<char> buffer,int *length,int *decimal_point)

{
  int iVar1;
  char *pcVar2;
  int *in_RCX;
  int *in_RDX;
  int i;
  int local_24;
  Vector<char> local_10;
  
  if (*in_RDX == 0) {
    pcVar2 = Vector<char>::operator[](&local_10,0);
    *pcVar2 = '1';
    *in_RCX = 1;
    *in_RDX = 1;
  }
  else {
    pcVar2 = Vector<char>::operator[](&local_10,*in_RDX + -1);
    *pcVar2 = *pcVar2 + '\x01';
    iVar1 = *in_RDX;
    while (local_24 = iVar1 + -1, 0 < local_24) {
      pcVar2 = Vector<char>::operator[](&local_10,local_24);
      if (*pcVar2 != ':') {
        return;
      }
      pcVar2 = Vector<char>::operator[](&local_10,local_24);
      *pcVar2 = '0';
      pcVar2 = Vector<char>::operator[](&local_10,iVar1 + -2);
      *pcVar2 = *pcVar2 + '\x01';
      iVar1 = local_24;
    }
    pcVar2 = Vector<char>::operator[](&local_10,0);
    if (*pcVar2 == ':') {
      pcVar2 = Vector<char>::operator[](&local_10,0);
      *pcVar2 = '1';
      *in_RCX = *in_RCX + 1;
    }
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}